

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pss_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  ulong uVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *pmVar4;
  ulong uVar5;
  size_t sVar6;
  size_t __n_00;
  long lVar7;
  uchar *input;
  long lVar8;
  mbedtls_md_context_t md_ctx;
  uchar salt [64];
  mbedtls_md_context_t local_b0;
  mbedtls_mpi *local_98;
  size_t local_90;
  void *local_88;
  ulong local_80;
  uchar local_78 [72];
  
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 1) {
      return -0x4080;
    }
LAB_0011483b:
    __n = ctx->len;
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar4 = mbedtls_md_info_from_type(md_alg);
      if (pmVar4 == (mbedtls_md_info_t *)0x0) goto LAB_001148e9;
      bVar2 = mbedtls_md_get_size(pmVar4);
      hashlen = (uint)bVar2;
    }
    pmVar4 = mbedtls_md_info_from_type(ctx->hash_id);
    iVar3 = -0x4080;
    if (pmVar4 != (mbedtls_md_info_t *)0x0) {
      bVar2 = mbedtls_md_get_size(pmVar4);
      local_80 = (ulong)bVar2;
      if ((uint)bVar2 + (uint)bVar2 <= __n) {
        lVar8 = __n - local_80;
        __n_00 = lVar8 - 2;
        if ((ulong)((uint)bVar2 + (uint)bVar2) + 2 <= __n) {
          __n_00 = local_80;
        }
        memset(sig,0,__n);
        iVar3 = (*f_rng)(p_rng,local_78,__n_00);
        if (iVar3 == 0) {
          local_98 = &ctx->N;
          local_88 = p_rng;
          local_90 = mbedtls_mpi_bitlen(local_98);
          lVar7 = lVar8 - __n_00;
          sig[lVar7 + -2] = '\x01';
          memcpy(sig + lVar7 + -1,local_78,__n_00);
          mbedtls_md_init(&local_b0);
          iVar3 = mbedtls_md_setup(&local_b0,pmVar4,0);
          if ((iVar3 == 0) && (iVar3 = mbedtls_md_starts(&local_b0), iVar3 == 0)) {
            input = sig + __n_00 + lVar7 + -1;
            iVar3 = mbedtls_md_update(&local_b0,input,8);
            if (((iVar3 == 0) &&
                (((iVar3 = mbedtls_md_update(&local_b0,hash,(ulong)hashlen), iVar3 == 0 &&
                  (iVar3 = mbedtls_md_update(&local_b0,local_78,__n_00), iVar3 == 0)) &&
                 (iVar3 = mbedtls_md_finish(&local_b0,input), uVar1 = local_80, iVar3 == 0)))) &&
               (uVar5 = (ulong)((local_90 + 7 & 7) == 0),
               iVar3 = mgf_mask(sig + uVar5,lVar8 + ~uVar5,input,local_80,&local_b0), iVar3 == 0)) {
              sVar6 = mbedtls_mpi_bitlen(local_98);
              *sig = *sig & (byte)(0xff >> (((char)__n * '\b' + '\x01') - (char)sVar6 & 0x1fU));
              input[uVar1] = 0xbc;
              mbedtls_platform_zeroize(local_78,0x40);
              iVar3 = 0;
            }
          }
          mbedtls_md_free(&local_b0);
          if (iVar3 == 0) {
            if (mode == 0) {
              iVar3 = mbedtls_rsa_public(ctx,sig,sig);
            }
            else {
              iVar3 = mbedtls_rsa_private(ctx,f_rng,local_88,sig,sig);
            }
          }
        }
        else {
          iVar3 = iVar3 + -0x4480;
        }
      }
    }
  }
  else {
    if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_0011483b;
LAB_001148e9:
    iVar3 = -0x4080;
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_rsassa_pss_sign( mbedtls_rsa_context *ctx,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng,
                         int mode,
                         mbedtls_md_type_t md_alg,
                         unsigned int hashlen,
                         const unsigned char *hash,
                         unsigned char *sig )
{
    size_t olen;
    unsigned char *p = sig;
    unsigned char salt[MBEDTLS_MD_MAX_SIZE];
    size_t slen, min_slen, hlen, offset = 0;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( ( md_alg  == MBEDTLS_MD_NONE &&
                        hashlen == 0 ) ||
                      hash != NULL );
    RSA_VALIDATE_RET( sig != NULL );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    /* Calculate the largest possible salt length. Normally this is the hash
     * length, which is the maximum length the salt can have. If there is not
     * enough room, use the maximum salt length that fits. The constraint is
     * that the hash length plus the salt length plus 2 bytes must be at most
     * the key length. This complies with FIPS 186-4 §5.5 (e) and RFC 8017
     * (PKCS#1 v2.2) §9.1.1 step 3. */
    min_slen = hlen - 2;
    if( olen < hlen + min_slen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    else if( olen >= hlen + hlen + 2 )
        slen = hlen;
    else
        slen = olen - hlen - 2;

    memset( sig, 0, olen );

    /* Generate salt of length slen */
    if( ( ret = f_rng( p_rng, salt, slen ) ) != 0 )
        return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

    /* Note: EMSA-PSS encoding is over the length of N - 1 bits */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    p += olen - hlen - slen - 2;
    *p++ = 0x01;
    memcpy( p, salt, slen );
    p += slen;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    /* Generate H = Hash( M' ) */
    if( ( ret = mbedtls_md_starts( &md_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, p, 8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, hash, hashlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_update( &md_ctx, salt, slen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md_finish( &md_ctx, p ) ) != 0 )
        goto exit;

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
        offset = 1;

    /* maskedDB: Apply dbMask to DB */
    if( ( ret = mgf_mask( sig + offset, olen - hlen - 1 - offset, p, hlen,
                          &md_ctx ) ) != 0 )
        goto exit;

    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    sig[0] &= 0xFF >> ( olen * 8 - msb );

    p += hlen;
    *p++ = 0xBC;

    mbedtls_platform_zeroize( salt, sizeof( salt ) );

exit:
    mbedtls_md_free( &md_ctx );

    if( ret != 0 )
        return( ret );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, sig, sig )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig ) );
}